

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator+
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,
          ChebyshevExpansion *ce2)

{
  Index IVar1;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pEVar2;
  Index IVar3;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_00;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other_00;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_148;
  vectype local_130;
  Type local_120;
  undefined1 local_e8 [8];
  VectorXd c_1;
  size_t n;
  vectype local_b8;
  Type local_a8;
  Index local_70;
  undefined1 local_68 [8];
  VectorXd c;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_48;
  Matrix<double,__1,_1,_0,__1,_1> local_30;
  ChebyshevExpansion *local_20;
  ChebyshevExpansion *ce2_local;
  ChebyshevExpansion *this_local;
  
  local_20 = ce2;
  ce2_local = this;
  this_local = __return_storage_ptr__;
  IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  pEVar2 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef(local_20);
  IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(pEVar2);
  if (IVar1 == IVar3) {
    this_00 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)coef(local_20);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_48,this_00,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_30,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_48);
    ChebyshevExpansion(__return_storage_ptr__,(vectype *)&local_30,this->m_xmin,this->m_xmax);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_30);
  }
  else {
    IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
    pEVar2 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef(local_20);
    IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(pEVar2);
    if (IVar3 < IVar1) {
      local_70 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                           ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_68,&local_70);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68);
      other = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef(local_20);
      pEVar2 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef(local_20);
      IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(pEVar2);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
                (&local_a8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68,IVar1);
      Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_a8,other);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&n,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_68,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_b8,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&n);
      ChebyshevExpansion(__return_storage_ptr__,&local_b8,this->m_xmin,this->m_xmax);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_b8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_68);
    }
    else {
      pEVar2 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef(local_20);
      c_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(pEVar2);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_e8,
                 (unsigned_long *)
                 &c_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e8);
      IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
                (&local_120,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e8,IVar1);
      Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_120,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
      other_00 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef(local_20);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                (&local_148,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_e8,other_00);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_130,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_148);
      ChebyshevExpansion(__return_storage_ptr__,&local_130,this->m_xmin,this->m_xmax);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_130);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::operator+(const ChebyshevExpansion &ce2) const {
        if (m_c.size() == ce2.coef().size()) {
            // Both are the same size, nothing creative to do, just add the coefficients
            return ChebyshevExpansion(std::move(ce2.coef() + m_c), m_xmin, m_xmax);
        }
        else{
            if (m_c.size() > ce2.coef().size()) {
                Eigen::VectorXd c(m_c.size()); c.setZero(); c.head(ce2.coef().size()) = ce2.coef();
                return ChebyshevExpansion(c+m_c, m_xmin, m_xmax);
            }
            else {
                std::size_t n = ce2.coef().size();
                Eigen::VectorXd c(n); c.setZero(); c.head(m_c.size()) = m_c;
                return ChebyshevExpansion(c + ce2.coef(), m_xmin, m_xmax);
            }
        }
    }